

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

string * get_temp_folder_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_9;
  
  std::__cxx11::string::string((string *)in_RDI,"/tmp/",&local_9);
  return in_RDI;
}

Assistant:

string get_temp_folder() {
#if defined(_MSC_VER) || defined(MS_WINDOWS) ||  defined(WIN32)
    string buffer;
    buffer.resize(1000);
    const auto new_size = GetTempPathA(buffer.size(), &buffer[0]); //deal with newsize == 0
    buffer.resize(new_size);
    return buffer;
#else
    return "/tmp/";
#endif
}